

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  uint64_t uVar1;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_50;
  undefined1 local_48 [40];
  
  GetLocation((Location *)(local_48 + 8),this);
  std::make_unique<wabt::MemoryModuleField,wabt::Location>((Location *)local_48);
  *(undefined4 *)((long)&(((Memory *)(local_48._0_8_ + 0x40))->page_limits).max + 7) =
       *(undefined4 *)((long)&page_limits->max + 7);
  uVar1 = page_limits->max;
  (((Memory *)(local_48._0_8_ + 0x40))->page_limits).initial = page_limits->initial;
  (((Memory *)(local_48._0_8_ + 0x40))->page_limits).max = uVar1;
  local_50._M_head_impl = (MemoryModuleField *)local_48._0_8_;
  local_48._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_50);
  if (local_50._M_head_impl != (MemoryModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_50._M_head_impl = (MemoryModuleField *)0x0;
  if ((long *)local_48._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}